

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O0

void gauss_newton(double *rgb,double *coeffs,int it)

{
  double dVar1;
  ostream *poVar2;
  runtime_error *this;
  double *pdVar3;
  int in_EDX;
  double *in_RSI;
  double *in_RDI;
  int j_1;
  double max;
  int j;
  double x [3];
  int rv;
  int P [4];
  double residual [3];
  double *J [3];
  double J2 [3];
  double J1 [3];
  double J0 [3];
  int i;
  double r;
  int local_11c;
  int local_10c;
  double local_108;
  double *in_stack_ffffffffffffff00;
  double *in_stack_ffffffffffffff08;
  double *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  double *in_stack_ffffffffffffff28;
  double *in_stack_ffffffffffffff30;
  double local_c8 [4];
  double *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  double local_48 [4];
  int local_24;
  double local_20;
  int local_14;
  double *local_10;
  double *local_8;
  
  local_20 = 0.0;
  local_24 = 0;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    if (local_14 <= local_24) {
      return;
    }
    local_a8 = local_48;
    local_a0 = local_68;
    local_98 = local_88;
    eval_residual(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    eval_jacobian(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                  (double **)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    in_stack_ffffffffffffff24 = LUPDecompose(&local_a8,3,1e-15,(int *)&stack0xffffffffffffff28);
    if (in_stack_ffffffffffffff24 != 1) break;
    LUPSolve(&local_a8,(int *)&stack0xffffffffffffff28,local_c8,3,&local_108);
    local_20 = 0.0;
    for (local_10c = 0; local_10c < 3; local_10c = local_10c + 1) {
      local_10[local_10c] = local_10[local_10c] - (&local_108)[local_10c];
      local_20 = local_c8[local_10c] * local_c8[local_10c] + local_20;
    }
    pdVar3 = std::max<double>(local_10,local_10 + 1);
    pdVar3 = std::max<double>(pdVar3,local_10 + 2);
    dVar1 = *pdVar3;
    if (200.0 < dVar1) {
      for (local_11c = 0; local_11c < 3; local_11c = local_11c + 1) {
        local_10[local_11c] = (200.0 / dVar1) * local_10[local_11c];
      }
    }
    if (local_20 < 1e-06) {
      return;
    }
    local_24 = local_24 + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"RGB ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_8);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_8[1]);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_8[2]);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"-> ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_10);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10[1]);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10[2]);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"LU decomposition failed!");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void gauss_newton(const double rgb[3], double coeffs[3], int it = 15) {
    double r = 0;
    for (int i = 0; i < it; ++i) {
        double J0[3], J1[3], J2[3], *J[3] = {J0, J1, J2};

        double residual[3];

        eval_residual(coeffs, rgb, residual);
        eval_jacobian(coeffs, rgb, J);

        int P[4];
        int rv = LUPDecompose(J, 3, 1e-15, P);
        if (rv != 1) {
            std::cout << "RGB " << rgb[0] << " " << rgb[1] << " " << rgb[2] << std::endl;
            std::cout << "-> " << coeffs[0] << " " << coeffs[1] << " " << coeffs[2]
                      << std::endl;
            throw std::runtime_error("LU decomposition failed!");
        }

        double x[3];
        LUPSolve(J, P, residual, 3, x);

        r = 0.0;
        for (int j = 0; j < 3; ++j) {
            coeffs[j] -= x[j];
            r += residual[j] * residual[j];
        }
        double max = std::max(std::max(coeffs[0], coeffs[1]), coeffs[2]);

        if (max > 200) {
            for (int j = 0; j < 3; ++j)
                coeffs[j] *= 200 / max;
        }

        if (r < 1e-6)
            break;
    }
}